

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O1

void __thiscall helics::FederateState::sendCommand(FederateState *this,ActionMessage *command)

{
  ulong uVar1;
  string_viewOps *__n_00;
  byte *__s;
  size_t __n_01;
  char *pcVar2;
  utilities *this_00;
  LogManager *pLVar3;
  string_view quoteChars;
  pointer pbVar4;
  pointer pbVar5;
  _Alloc_hider __src;
  int iVar6;
  void *pvVar7;
  string *psVar8;
  string_viewOps *psVar9;
  unsigned_long uVar10;
  char *extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar11;
  size_type __n;
  size_type __rlen_11;
  size_type __rlen;
  double dVar12;
  string_view V;
  string_view V_00;
  string_view V_01;
  string_view V_02;
  string_view trimCharacters;
  string_view line;
  string_view logMessageSource;
  string_view fmt;
  string_view str;
  string_view str_00;
  string_view fmt_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view message;
  format_args args;
  format_args args_00;
  string_viewVector res;
  ActionMessage barrier;
  delimiter_compression in_stack_fffffffffffffea8;
  string_viewVector local_148;
  string local_130;
  basic_string_view<char,_std::char_traits<char>_> local_110;
  ActionMessage local_100;
  pointer local_48;
  size_type sStack_40;
  
  __n_00 = (string_viewOps *)(command->payload).bufferSize;
  __s = (command->payload).heap;
  local_110._M_len = (size_t)__n_00;
  local_110._M_str = (char *)__s;
  if (__n_00 == (string_viewOps *)0x0) {
    psVar9 = (string_viewOps *)0xffffffffffffffff;
  }
  else {
    pvVar7 = memchr(__s,0x23,(size_t)__n_00);
    psVar9 = (string_viewOps *)(-(ulong)(pvVar7 == (void *)0x0) | (long)pvVar7 - (long)__s);
  }
  if ((psVar9 != (string_viewOps *)0xffffffffffffffff) &&
     (psVar9 = psVar9 + -1, local_110._M_len = (size_t)psVar9, local_110._M_str = (char *)__s,
     __n_00 < psVar9)) {
    psVar9 = __n_00;
    local_110._M_len = (size_t)__n_00;
  }
  trimCharacters._M_str = (char *)psVar9;
  trimCharacters._M_len = (size_t)" \t\n\r";
  gmlc::utilities::string_viewOps::trimString
            ((string_viewOps *)&local_110,(string_view *)0x4,trimCharacters);
  aVar11.values_ = (value<fmt::v11::context> *)0x0;
  quoteChars._M_str = (char *)0x447f49;
  quoteChars._M_len = 3;
  line._M_str = (char *)0x1;
  line._M_len = (size_t)local_110._M_str;
  gmlc::utilities::string_viewOps::splitlineQuotes
            (&local_148,(string_viewOps *)local_110._M_len,line,(string_view)ZEXT816(0x447e15),
             quoteChars,in_stack_fffffffffffffea8);
  pbVar5 = local_148.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar4 = local_148.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_148.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_148.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00332168;
  __n_01 = (local_148.
            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start)->_M_len;
  uVar1 = __n_01 - 3;
  if (uVar1 < 0xd) {
    pcVar2 = (local_148.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->_M_str;
    switch(uVar1) {
    case 0:
switchD_00331ab5_caseD_0:
      iVar6 = bcmp(pcVar2,"log",__n_01);
      if (iVar6 == 0) {
        psVar8 = ActionMessage::getString_abi_cxx11_(command,1);
        uVar1 = (command->payload).bufferSize;
        if (uVar1 < 4) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     4,uVar1);
        }
        message._M_len = uVar1 - 4;
        message._M_str = (command->payload).heap + 4;
        logMessageSource._M_str = (psVar8->_M_dataplus)._M_p;
        logMessageSource._M_len = psVar8->_M_string_length;
        logMessage(this,6,logMessageSource,message,false);
        goto LAB_00332168;
      }
      if (__n_01 == 5) goto switchD_00331ab5_caseD_2;
      if (__n_01 == 3) {
        iVar6 = bcmp(pcVar2,"set",3);
        if ((((0x20 < (ulong)((long)pbVar5 - (long)pbVar4)) && (iVar6 == 0)) &&
            (pbVar4[1]._M_len == 7)) && (iVar6 = bcmp(pbVar4[1]._M_str,"barrier",7), iVar6 == 0)) {
          ActionMessage::ActionMessage(&local_100,cmd_time_barrier);
          local_100.dest_id.gid = (this->global_id)._M_i.gid;
          V._M_str = extraout_RDX;
          V._M_len = (size_t)local_148.
                             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[2]._M_str;
          dVar12 = gmlc::utilities::numeric_conversionComplete<double>
                             ((utilities *)
                              local_148.
                              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[2]._M_len,V,0.0);
          local_100.actionTime.internalTimeCode = 0x7fffffffffffffff;
          if (dVar12 <= -9223372036.854765) {
            local_100.actionTime.internalTimeCode = -0x7fffffffffffffff;
          }
          else if (dVar12 < 9223372036.854765) {
            local_100.actionTime.internalTimeCode =
                 (baseType)
                 (dVar12 * 1000000000.0 +
                 *(double *)(&DAT_00436020 + (ulong)(0.0 <= dVar12 * 1000000000.0) * 8));
          }
          if (0x30 < (ulong)((long)local_148.
                                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_148.
                                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            V_02._M_str = (char *)0x0;
            V_02._M_len = (size_t)local_148.
                                  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[3]._M_str;
            local_100.messageID =
                 gmlc::utilities::numeric_conversionComplete<int>
                           ((utilities *)
                            local_148.
                            super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[3]._M_len,V_02,
                            (int)((long)local_148.
                                        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_148.
                                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start));
          }
          gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>
          ::push<helics::ActionMessage&>
                    ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                     &this->queue,&local_100);
          goto LAB_003321e6;
        }
LAB_003320ff:
        if (__n_01 == 5) goto switchD_00331ab5_caseD_2;
      }
      break;
    case 1:
switchD_00331ab5_caseD_1:
      iVar6 = bcmp(pcVar2,"halt",__n_01);
      if (iVar6 == 0) {
LAB_00331d39:
        if (this->mAllowRemoteControl == true) {
          if (this->mParent == (CommonCore *)0x0) goto LAB_00332168;
          ActionMessage::ActionMessage(&local_100,cmd_disconnect);
          local_100.source_id.gid = (this->global_id)._M_i.gid;
          local_100.dest_id.gid = local_100.source_id.gid;
          BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_100);
        }
        else {
          if (this->mParent == (CommonCore *)0x0) goto LAB_00332168;
          ActionMessage::ActionMessage(&local_100,command->messageAction);
          local_48 = (this->name)._M_dataplus._M_p;
          sStack_40 = (this->name)._M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x28;
          args_00.field_1.args_ = aVar11.args_;
          args_00.desc_ = (unsigned_long_long)&local_48;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_130,(v11 *)"log {} does not allow remote termination",fmt_00,args_00);
          __src._M_p = local_130._M_dataplus._M_p;
          if ((byte *)local_130._M_dataplus._M_p == local_100.payload.heap) {
            local_100.payload.bufferSize = local_130._M_string_length;
          }
          else {
            SmallBuffer::reserve(&local_100.payload,local_130._M_string_length);
            local_100.payload.bufferSize = local_130._M_string_length;
            if (local_130._M_string_length != 0) {
              memcpy(local_100.payload.heap,__src._M_p,local_130._M_string_length);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
          }
          local_100.dest_id.gid = (command->source_id).gid;
          local_100.source_id.gid = (this->global_id)._M_i.gid;
          psVar8 = ActionMessage::getString_abi_cxx11_(command,1);
          str_01._M_str = (psVar8->_M_dataplus)._M_p;
          str_01._M_len = psVar8->_M_string_length;
          ActionMessage::setString(&local_100,0,str_01);
          str_02._M_str = (this->name)._M_dataplus._M_p;
          str_02._M_len = (this->name)._M_string_length;
          ActionMessage::setString(&local_100,1,str_02);
          BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_100);
        }
        goto LAB_003321e6;
      }
      if (uVar1 < 0xd) {
        uVar10 = (long)&switchD_00331ae9::switchdataD_00453fd0 +
                 (long)(int)(&switchD_00331ae9::switchdataD_00453fd0)[uVar1];
        switch(uVar1) {
        case 0:
          goto switchD_00331ab5_caseD_0;
        case 1:
          iVar6 = bcmp(pcVar2,"echo",__n_01);
          if (iVar6 == 0) {
            if (this->mParent == (CommonCore *)0x0) goto LAB_00332168;
            ActionMessage::ActionMessage(&local_100,command->messageAction);
            SmallBuffer::operator=(&local_100.payload,(char (*) [11])"echo_reply");
            local_100.dest_id.gid = (command->source_id).gid;
            local_100.source_id.gid = (this->global_id)._M_i.gid;
            psVar8 = ActionMessage::getString_abi_cxx11_(command,1);
            str_03._M_str = (psVar8->_M_dataplus)._M_p;
            str_03._M_len = psVar8->_M_string_length;
            ActionMessage::setString(&local_100,0,str_03);
            str_04._M_str = (this->name)._M_dataplus._M_p;
            str_04._M_len = (this->name)._M_string_length;
            ActionMessage::setString(&local_100,1,str_04);
            BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_100);
            goto LAB_003321e6;
          }
          if ((long)__n_01 < 9) {
            if (__n_01 == 3) goto switchD_00331ab5_caseD_0;
            goto LAB_003320ff;
          }
          if (__n_01 == 9) goto switchD_00331b60_caseD_6;
          if (__n_01 == 0xf) goto switchD_00331ab5_caseD_c;
          if (__n_01 == 0xe) goto switchD_00331ab5_caseD_b;
          break;
        case 2:
          goto switchD_00331ab5_caseD_2;
        case 6:
switchD_00331b60_caseD_6:
          iVar6 = bcmp(pcVar2,"logbuffer",__n_01);
          if (iVar6 == 0) {
            if (0x10 < (ulong)((long)pbVar5 - (long)pbVar4)) {
              this_00 = (utilities *)pbVar4[1]._M_len;
              pcVar2 = pbVar4[1]._M_str;
              if ((this_00 != (utilities *)0x4) || (iVar6 = bcmp(pcVar2,"stop",4), iVar6 != 0)) {
                pLVar3 = (this->mLogManager)._M_t.
                         super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                         .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl;
                V_00._M_str = (char *)0xa;
                V_00._M_len = (size_t)pcVar2;
                uVar10 = gmlc::utilities::numeric_conversion<unsigned_long>(this_00,V_00,uVar10);
                LogBuffer::resize(&pLVar3->mLogBuffer,uVar10);
                goto LAB_00332168;
              }
            }
            LogBuffer::enable(&((this->mLogManager)._M_t.
                                super___uniq_ptr_impl<helics::LogManager,_std::default_delete<helics::LogManager>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_helics::LogManager_*,_std::default_delete<helics::LogManager>_>
                                .super__Head_base<0UL,_helics::LogManager_*,_false>._M_head_impl)->
                               mLogBuffer,(ulong)((long)pbVar5 - (long)pbVar4) < 0x11);
            goto LAB_00332168;
          }
          if ((uVar1 >> 1 | (ulong)((uVar1 & 1) != 0) << 0x3f) < 7) {
            (*(code *)(&DAT_00454020 + *(int *)(&DAT_00454020 + (uVar1 >> 1) * 4)))();
            return;
          }
          break;
        case 0xb:
          goto switchD_00331ab5_caseD_b;
        case 0xc:
          goto switchD_00331ab5_caseD_c;
        }
      }
      break;
    case 2:
switchD_00331ab5_caseD_2:
      iVar6 = bcmp(pcVar2,"clear",__n_01);
      if (((0x10 < (ulong)((long)pbVar5 - (long)pbVar4)) && (iVar6 == 0)) &&
         ((pbVar4[1]._M_len == 7 && (iVar6 = bcmp(pbVar4[1]._M_str,"barrier",7), iVar6 == 0)))) {
        ActionMessage::ActionMessage(&local_100,cmd_time_barrier_clear);
        local_100.dest_id.gid = (this->global_id)._M_i.gid;
        if (0x20 < (ulong)((long)local_148.
                                 super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_148.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)) {
          V_01._M_str = (char *)0x0;
          V_01._M_len = (size_t)local_148.
                                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[2]._M_str;
          local_100.messageID =
               gmlc::utilities::numeric_conversionComplete<int>
                         ((utilities *)
                          local_148.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_len,V_01,
                          (int)((long)local_148.
                                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_148.
                                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
        }
        gmlc::containers::BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
        push<helics::ActionMessage&>
                  ((BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                   &this->queue,&local_100);
LAB_003321e6:
        ActionMessage::~ActionMessage(&local_100);
        goto LAB_00332168;
      }
      break;
    case 6:
      iVar6 = bcmp(pcVar2,"terminate",__n_01);
      if (iVar6 == 0) goto LAB_00331d39;
      if (uVar1 < 0xd) {
        uVar10 = (long)&switchD_00331b60::switchdataD_00453f9c +
                 (long)(int)(&switchD_00331b60::switchdataD_00453f9c)[uVar1];
        switch(uVar1) {
        case 0:
          goto switchD_00331ab5_caseD_0;
        case 1:
          goto switchD_00331ab5_caseD_1;
        case 2:
          goto switchD_00331ab5_caseD_2;
        case 6:
          goto switchD_00331b60_caseD_6;
        case 0xb:
          goto switchD_00331ab5_caseD_b;
        case 0xc:
          goto switchD_00331ab5_caseD_c;
        }
      }
      break;
    case 0xb:
switchD_00331ab5_caseD_b:
      iVar6 = bcmp(pcVar2,"command_status",__n_01);
      if (iVar6 == 0) {
        if (this->mParent == (CommonCore *)0x0) goto LAB_00332168;
        ActionMessage::ActionMessage(&local_100,command->messageAction);
        local_48 = (pointer)gmlc::containers::
                            BlockingQueue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::mutex,_std::condition_variable>
                            ::size(&this->commandQueue);
        fmt.size_ = 4;
        fmt.data_ = (char *)0x19;
        args.field_1.args_ = aVar11.args_;
        args.desc_ = (unsigned_long_long)&local_48;
        ::fmt::v11::vformat_abi_cxx11_(&local_130,(v11 *)"\"{} unprocessed commands\"",fmt,args);
        SmallBuffer::operator=(&local_100.payload,&local_130);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        local_100.dest_id.gid = (command->source_id).gid;
        local_100.source_id.gid = (this->global_id)._M_i.gid;
        psVar8 = ActionMessage::getString_abi_cxx11_(command,1);
        str._M_str = (psVar8->_M_dataplus)._M_p;
        str._M_len = psVar8->_M_string_length;
        ActionMessage::setString(&local_100,0,str);
        str_00._M_str = (this->name)._M_dataplus._M_p;
        str_00._M_len = (this->name)._M_string_length;
        ActionMessage::setString(&local_100,1,str_00);
        BrokerBase::addActionMessage(&this->mParent->super_BrokerBase,&local_100);
        goto LAB_003321e6;
      }
      if ((uVar1 >> 1 | (ulong)((uVar1 & 1) != 0) << 0x3f) < 7) {
        (*(code *)(&DAT_00454004 + *(int *)(&DAT_00454004 + (uVar1 >> 1) * 4)))();
        return;
      }
      break;
    case 0xc:
switchD_00331ab5_caseD_c:
      iVar6 = bcmp(pcVar2,"timeout_monitor",__n_01);
      if (iVar6 == 0) {
        setProperty(this,0xa1,(Time)(command->actionTime).internalTimeCode);
        goto LAB_00332168;
      }
      if (__n_01 == 5) goto switchD_00331ab5_caseD_2;
      if (__n_01 == 3) goto switchD_00331ab5_caseD_0;
    }
  }
  psVar8 = ActionMessage::getString_abi_cxx11_(command,1);
  gmlc::containers::
  BlockingQueue<std::pair<std::__cxx11::string,std::__cxx11::string>,std::mutex,std::condition_variable>
  ::emplace<std::basic_string_view<char,std::char_traits<char>>&,std::__cxx11::string_const&>
            ((BlockingQueue<std::pair<std::__cxx11::string,std::__cxx11::string>,std::mutex,std::condition_variable>
              *)&this->commandQueue,&local_110,psVar8);
LAB_00332168:
  if (local_148.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FederateState::sendCommand(ActionMessage& command)
{
    auto cmd = command.payload.to_string();
    auto commentLoc = cmd.find('#');
    if (commentLoc != std::string_view::npos) {
        cmd = cmd.substr(0, commentLoc - 1);
    }
    gmlc::utilities::string_viewOps::trimString(cmd);
    auto res = gmlc::utilities::string_viewOps::splitlineQuotes(
        cmd,
        " ",
        gmlc::utilities::string_viewOps::default_quote_chars,
        gmlc::utilities::string_viewOps::delimiter_compression::on);
    if (res.empty()) {
        return;
    }

    if (res[0] == "terminate" || res[0] == "halt") {
        if (mAllowRemoteControl) {
            if (mParent != nullptr) {
                ActionMessage bye(CMD_DISCONNECT);
                bye.source_id = global_id.load();
                bye.dest_id = bye.source_id;
                mParent->addActionMessage(bye);
            }
        } else {
            if (mParent != nullptr) {
                ActionMessage response(command.action());
                response.payload =
                    fmt::format("log {} does not allow remote termination", getIdentifier());
                response.dest_id = command.source_id;
                response.source_id = global_id.load();
                response.setString(targetStringLoc, command.getString(sourceStringLoc));
                response.setString(sourceStringLoc, getIdentifier());

                mParent->addActionMessage(std::move(response));
            }
        }
    } else if (res[0] == "echo") {
        if (mParent != nullptr) {
            ActionMessage response(command.action());
            response.payload = "echo_reply";
            response.dest_id = command.source_id;
            response.source_id = global_id.load();
            response.setString(targetStringLoc, command.getString(sourceStringLoc));
            response.setString(sourceStringLoc, getIdentifier());

            mParent->addActionMessage(std::move(response));
        }
    } else if (res[0] == "command_status") {
        if (mParent != nullptr) {
            ActionMessage response(command.action());
            response.payload = fmt::format("\"{} unprocessed commands\"", commandQueue.size());
            response.dest_id = command.source_id;
            response.source_id = global_id.load();
            response.setString(targetStringLoc, command.getString(sourceStringLoc));
            response.setString(sourceStringLoc, getIdentifier());

            mParent->addActionMessage(std::move(response));
        }
    } else if (res[0] == "logbuffer") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->getLogBuffer().enable(false);
            } else {
                mLogManager->getLogBuffer().resize(gmlc::utilities::numeric_conversion<std::size_t>(
                    res[1], LogBuffer::cDefaultBufferSize));
            }
        } else {
            mLogManager->getLogBuffer().enable(true);
        }
    } else if (res[0] == "remotelog") {
        if (res.size() > 1) {
            if (res[1] == "stop") {
                mLogManager->updateRemote(command.source_id, HELICS_LOG_LEVEL_NO_PRINT);
            } else {
                int newLevel{HELICS_LOG_LEVEL_NO_PRINT};
                if (isdigit(res[1][0]) != 0) {
                    newLevel =
                        gmlc::utilities::numeric_conversion<int>(res[1],
                                                                 mLogManager->getConsoleLevel());
                } else {
                    newLevel = logLevelFromString(res[1]);
                }
                mLogManager->updateRemote(command.source_id, newLevel);
            }
        } else {
            mLogManager->updateRemote(command.source_id, mLogManager->getConsoleLevel());
        }
        maxLogLevel = mLogManager->getMaxLevel();
    } else if (res[0] == "timeout_monitor") {
        setProperty(defs::Properties::GRANT_TIMEOUT, command.actionTime);
    } else if (res[0] == "log") {
        logMessage(HELICS_LOG_LEVEL_SUMMARY,
                   command.getString(sourceStringLoc),
                   command.payload.to_string().substr(4));
    } else if ((res[0] == "set") && (res.size() > 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER);
        barrier.dest_id = global_id;
        barrier.actionTime = gmlc::utilities::numeric_conversionComplete<double>(res[2], 0.0);
        if (res.size() >= 4) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[3], 0);
        }

        queue.push(barrier);
    } else if ((res[0] == "clear") && (res.size() >= 2 && res[1] == "barrier")) {
        ActionMessage barrier(CMD_TIME_BARRIER_CLEAR);
        barrier.dest_id = global_id;
        if (res.size() >= 3) {
            barrier.messageID =
                gmlc::utilities::numeric_conversionComplete<std::int32_t>(res[2], 0);
        }
        queue.push(barrier);
    } else {
        commandQueue.emplace(cmd, command.getString(sourceStringLoc));
    }
}